

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall
AbstractModuleClient::sendPlaybackCommand(AbstractModuleClient *this,string *cmd,uint32_t time)

{
  string *in_RSI;
  TrodesMsg *in_RDI;
  TrodesMsg msg;
  TrodesMsg *this_00;
  string *subject;
  AbstractModuleClient *in_stack_ffffffffffffff40;
  string local_b8 [32];
  string local_98 [28];
  uint in_stack_ffffffffffffff84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  TrodesMsg *in_stack_ffffffffffffffa0;
  
  subject = (string *)&stack0xffffffffffffff9f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,"ss4",(allocator *)subject);
  std::__cxx11::string::string(local_98,in_RSI);
  TrodesMsg::TrodesMsg<char_const*,std::__cxx11::string,unsigned_int>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  this_00 = (TrodesMsg *)&stack0xffffffffffffff47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"cmd",(allocator *)this_00);
  sendMsgToTrodes(in_stack_ffffffffffffff40,subject,in_RDI);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  TrodesMsg::~TrodesMsg(this_00);
  return;
}

Assistant:

void AbstractModuleClient::sendPlaybackCommand(std::string cmd, uint32_t time) {
    TrodesMsg msg("ss4", acquisition_CMD, cmd, time);
    sendMsgToTrodes(TRODES_CMD, msg); //tell trodes to relay the command
}